

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

int __thiscall
BamTools::BamAlignment::GetEndPosition(BamAlignment *this,bool usePadded,bool closedInterval)

{
  bool bVar1;
  reference pCVar2;
  byte in_DL;
  byte in_SIL;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  *in_RDI;
  CigarOp *op;
  const_iterator cigarEnd;
  const_iterator cigarIter;
  int alignEnd;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
  local_18;
  int local_10;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  local_10 = *(int *)((long)&in_RDI[0x15]._M_current + 4);
  local_18._M_current =
       (CigarOp *)
       std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::begin
                 ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::end
            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (!bVar1) {
      if ((local_a & 1) != 0) {
        local_10 = local_10 + -1;
      }
      return local_10;
    }
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
             ::operator*(&local_18);
    in_stack_ffffffffffffffcc = (int)pCVar2->Type;
    if ((in_stack_ffffffffffffffcc == 0x3d) || (in_stack_ffffffffffffffcc == 0x44)) {
LAB_001be43f:
      local_10 = pCVar2->Length + local_10;
    }
    else if (in_stack_ffffffffffffffcc == 0x49) {
      if ((local_9 & 1) != 0) {
        local_10 = pCVar2->Length + local_10;
      }
    }
    else if ((in_stack_ffffffffffffffcc - 0x4dU < 2) || (in_stack_ffffffffffffffcc == 0x58))
    goto LAB_001be43f;
    __gnu_cxx::
    __normal_iterator<const_BamTools::CigarOp_*,_std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>_>
    ::operator++(&local_18);
  } while( true );
}

Assistant:

int BamAlignment::GetEndPosition(bool usePadded, bool closedInterval) const
{

    // initialize alignment end to starting position
    int alignEnd = Position;

    // iterate over cigar operations
    std::vector<CigarOp>::const_iterator cigarIter = CigarData.begin();
    std::vector<CigarOp>::const_iterator cigarEnd = CigarData.end();
    for (; cigarIter != cigarEnd; ++cigarIter) {
        const CigarOp& op = (*cigarIter);

        switch (op.Type) {

            // increase end position on CIGAR chars [DMXN=]
            case Constants::BAM_CIGAR_DEL_CHAR:
            case Constants::BAM_CIGAR_MATCH_CHAR:
            case Constants::BAM_CIGAR_MISMATCH_CHAR:
            case Constants::BAM_CIGAR_REFSKIP_CHAR:
            case Constants::BAM_CIGAR_SEQMATCH_CHAR:
                alignEnd += op.Length;
                break;

            // increase end position on insertion, only if @usePadded is true
            case Constants::BAM_CIGAR_INS_CHAR:
                if (usePadded) alignEnd += op.Length;
                break;

            // all other CIGAR chars do not affect end position
            default:
                break;
        }
    }

    // adjust for closedInterval, if requested
    if (closedInterval) alignEnd -= 1;

    // return result
    return alignEnd;
}